

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

uint32_t LogLuv32fromXYZ(float *XYZ,int em)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  
  iVar1 = LogL16fromY((double)XYZ[1],em);
  dVar6 = (double)XYZ[2] * 3.0 + (double)XYZ[1] * 15.0 + (double)*XYZ;
  if (dVar6 <= 0.0 || iVar1 == 0) {
    dVar7 = 0.210526316;
    dVar6 = 0.473684211;
  }
  else {
    dVar7 = ((double)*XYZ * 4.0) / dVar6;
    dVar6 = ((double)XYZ[1] * 9.0) / dVar6;
  }
  uVar5 = 0;
  uVar4 = 0;
  if (0.0 < dVar7) {
    dVar7 = dVar7 * 410.0;
    if (em != 0) {
      iVar2 = rand();
      dVar7 = (double)iVar2 * 4.656612875245797e-10 + dVar7 + -0.5;
    }
    uVar4 = (uint)dVar7;
  }
  if (0.0 < dVar6) {
    dVar6 = dVar6 * 410.0;
    if (em != 0) {
      iVar2 = rand();
      dVar6 = (double)iVar2 * 4.656612875245797e-10 + dVar6 + -0.5;
    }
    uVar5 = (uint)dVar6;
  }
  if (0xfe < uVar4) {
    uVar4 = 0xff;
  }
  uVar3 = 0xff;
  if (uVar5 < 0xff) {
    uVar3 = uVar5;
  }
  return uVar4 << 8 | uVar3 | iVar1 << 0x10;
}

Assistant:

uint32_t
    LogLuv32fromXYZ(float *XYZ, int em)
{
    unsigned int Le, ue, ve;
    double u, v, s;
    /* encode luminance */
    Le = (unsigned int)LogL16fromY(XYZ[1], em);
    /* encode color */
    s = XYZ[0] + 15. * XYZ[1] + 3. * XYZ[2];
    if (!Le || s <= 0.)
    {
        u = U_NEU;
        v = V_NEU;
    }
    else
    {
        u = 4. * XYZ[0] / s;
        v = 9. * XYZ[1] / s;
    }
    if (u <= 0.)
        ue = 0;
    else
        ue = tiff_itrunc(UVSCALE * u, em);
    if (ue > 255)
        ue = 255;
    if (v <= 0.)
        ve = 0;
    else
        ve = tiff_itrunc(UVSCALE * v, em);
    if (ve > 255)
        ve = 255;
    /* combine encodings */
    return (Le << 16 | ue << 8 | ve);
}